

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

bool soul::isFollowedByBlankLine(CodeLocation *pos)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  string local_48;
  CodeLocation local_28;
  
  CodeLocation::getSourceLine_abi_cxx11_(&local_48,pos);
  if (local_48._M_string_length != 0) {
    psVar1 = &local_48._M_string_length;
    sVar3 = local_48._M_string_length;
    do {
      if ((4 < (byte)local_48._M_dataplus._M_p[sVar3 - 1] - 9) &&
         (local_48._M_dataplus._M_p[sVar3 - 1] != 0x20)) {
        paVar2 = &local_48.field_2;
        local_48._M_dataplus._M_p[sVar3] = '\0';
        local_88 = &local_78;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == paVar2) {
          local_78._8_8_ = local_48.field_2._8_8_;
        }
        else {
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_48._M_dataplus._M_p;
        }
        local_78._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
        local_80 = sVar3;
        local_48._M_dataplus._M_p = (pointer)paVar2;
        local_48._M_string_length = sVar3;
        goto LAB_001d0f6f;
      }
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  paVar2 = &local_78;
  psVar1 = &local_80;
  local_88 = paVar2;
LAB_001d0f6f:
  *psVar1 = 0;
  sVar3 = local_80;
  paVar2->_M_local_buf[0] = '\0';
  if (local_80 == 0) {
    bVar5 = true;
  }
  else {
    CodeLocation::getStartOfNextLine(&local_28);
    CodeLocation::getSourceLine_abi_cxx11_(&local_68,&local_28);
    if (local_68._M_string_length != 0) {
      psVar1 = &local_68._M_string_length;
      sVar4 = local_68._M_string_length;
      do {
        if ((4 < (byte)local_68._M_dataplus._M_p[sVar4 - 1] - 9) &&
           (local_68._M_dataplus._M_p[sVar4 - 1] != 0x20)) {
          paVar2 = &local_68.field_2;
          local_68._M_dataplus._M_p[sVar4] = '\0';
          local_a8 = &local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p == paVar2) {
            local_98._8_8_ = local_68.field_2._8_8_;
          }
          else {
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_68._M_dataplus._M_p;
          }
          local_98._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
          local_a0 = sVar4;
          local_68._M_dataplus._M_p = (pointer)paVar2;
          local_68._M_string_length = sVar4;
          goto LAB_001d1017;
        }
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
    }
    paVar2 = &local_98;
    psVar1 = &local_a0;
    local_a8 = paVar2;
LAB_001d1017:
    *psVar1 = 0;
    paVar2->_M_local_buf[0] = '\0';
    bVar5 = local_a0 == 0;
  }
  if (sVar3 != 0) {
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

static bool isFollowedByBlankLine (CodeLocation pos)
{
    return choc::text::trimEnd (pos.getSourceLine()).empty()
        || choc::text::trimEnd (pos.getStartOfNextLine().getSourceLine()).empty();
}